

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O2

bool Diligent::VerifyDrawIndexedAttribs(DrawIndexedAttribs *Attribs)

{
  char (*in_R9) [34];
  string msg;
  Char *local_18;
  
  if (1 < (byte)(Attribs->IndexType - VT_UINT16)) {
    local_18 = GetValueTypeString(Attribs->IndexType);
    FormatString<char[35],char[12],char_const*,char[34]>
              (&msg,(Diligent *)"Draw indexed attribs are invalid: ",(char (*) [35])0x65ebc2,
               (char (*) [12])&local_18,(char **)") must be VT_UINT16 or VT_UINT32.",in_R9);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyDrawIndexedAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x44);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (Attribs->NumIndices == 0) {
    FormatString<char[110]>
              (&msg,(char (*) [110])
                    "DrawIndexedAttribs.NumIndices is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  if (Attribs->NumInstances == 0) {
    FormatString<char[105]>(&msg,(char (*) [105])0x65db50);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  return true;
}

Assistant:

bool VerifyDrawIndexedAttribs(const DrawIndexedAttribs& Attribs)
{
#define CHECK_DRAW_INDEXED_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Draw indexed attribs are invalid: ", __VA_ARGS__)

    CHECK_DRAW_INDEXED_ATTRIBS(Attribs.IndexType == VT_UINT16 || Attribs.IndexType == VT_UINT32,
                               "IndexType (", GetValueTypeString(Attribs.IndexType), ") must be VT_UINT16 or VT_UINT32.");

    if (Attribs.NumIndices == 0)
        LOG_INFO_MESSAGE("DrawIndexedAttribs.NumIndices is 0. This is OK as the draw command will be ignored, but may be unintentional.");
    if (Attribs.NumInstances == 0)
        LOG_INFO_MESSAGE("DrawAttribs.NumInstances is 0. This is OK as the draw command will be ignored, but may be unintentional.");

#undef CHECK_DRAW_INDEXED_ATTRIBS

    return true;
}